

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O1

bool __thiscall
spvtools::val::ValidationState_t::RegisterUniqueTypeDeclaration
          (ValidationState_t *this,Instruction *inst)

{
  ushort uVar1;
  pointer puVar2;
  uint uVar3;
  pointer psVar4;
  long lVar5;
  ulong uVar6;
  pair<std::_Rb_tree_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_bool>
  pVar7;
  vector<unsigned_int,_std::allocator<unsigned_int>_> key;
  uint local_4c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4c = (uint)(inst->inst_).opcode;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
            (&local_48,(iterator)0x0,&local_4c);
  psVar4 = (inst->operands_).
           super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((inst->operands_).
      super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl.
      super__Vector_impl_data._M_finish != psVar4) {
    lVar5 = 4;
    uVar6 = 0;
    do {
      if (*(int *)((long)&psVar4->offset + lVar5) != 3) {
        uVar1 = *(ushort *)((long)psVar4 + lVar5 + -4);
        uVar3 = (uint)*(ushort *)((long)psVar4 + lVar5 + -2) + (uint)uVar1;
        puVar2 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if ((int)((ulong)((long)(inst->words_).
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)puVar2) >> 2) <
            (int)uVar3) {
          __assert_fail("words_end <= static_cast<int>(inst->words().size())",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp"
                        ,0x34c,
                        "bool spvtools::val::ValidationState_t::RegisterUniqueTypeDeclaration(const Instruction *)"
                       );
        }
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_48,
                   local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish,puVar2 + uVar1,puVar2 + uVar3);
      }
      uVar6 = uVar6 + 1;
      psVar4 = (inst->operands_).
               super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x10;
    } while (uVar6 < (ulong)((long)(inst->operands_).
                                   super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)psVar4 >> 4));
  }
  pVar7 = std::
          _Rb_tree<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::_Identity<std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::less<std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
          ::_M_insert_unique<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                    ((_Rb_tree<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::_Identity<std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::less<std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                      *)&this->unique_type_declarations_,&local_48);
  if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return (bool)(pVar7.second & 1);
}

Assistant:

bool ValidationState_t::RegisterUniqueTypeDeclaration(const Instruction* inst) {
  std::vector<uint32_t> key;
  key.push_back(static_cast<uint32_t>(inst->opcode()));
  for (size_t index = 0; index < inst->operands().size(); ++index) {
    const spv_parsed_operand_t& operand = inst->operand(index);

    if (operand.type == SPV_OPERAND_TYPE_RESULT_ID) continue;

    const int words_begin = operand.offset;
    const int words_end = words_begin + operand.num_words;
    assert(words_end <= static_cast<int>(inst->words().size()));

    key.insert(key.end(), inst->words().begin() + words_begin,
               inst->words().begin() + words_end);
  }

  return unique_type_declarations_.insert(std::move(key)).second;
}